

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGuiStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiTextEditState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  int iVar1;
  unsigned_short *puVar2;
  int iVar3;
  value_type_conflict *pvVar4;
  ImWchar *text;
  int new_text_len_utf8;
  int text_len;
  int new_text_len_local;
  ImWchar *new_text_local;
  int pos_local;
  ImGuiTextEditState *obj_local;
  
  iVar1 = obj->CurLenW;
  if (pos <= iVar1) {
    if ((obj->Text).Size < new_text_len + iVar1 + 1) {
      obj_local._7_1_ = false;
    }
    else {
      iVar3 = ImTextCountUtf8BytesFromStr(new_text,new_text + new_text_len);
      if (obj->BufSizeA < iVar3 + obj->CurLenA + 1) {
        obj_local._7_1_ = false;
      }
      else {
        puVar2 = (obj->Text).Data;
        if (pos != iVar1) {
          memmove(puVar2 + (long)pos + (long)new_text_len,puVar2 + pos,(long)(iVar1 - pos) << 1);
        }
        memcpy(puVar2 + pos,new_text,(long)new_text_len << 1);
        obj->CurLenW = new_text_len + obj->CurLenW;
        obj->CurLenA = iVar3 + obj->CurLenA;
        pvVar4 = ImVector<unsigned_short>::operator[](&obj->Text,obj->CurLenW);
        *pvVar4 = 0;
        obj_local._7_1_ = true;
      }
    }
    return obj_local._7_1_;
  }
  __assert_fail("pos <= text_len",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                ,0x1d0b,
                "bool ImGuiStb::STB_TEXTEDIT_INSERTCHARS(ImGuiTextEditState *, int, const ImWchar *, int)"
               );
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);
    if (new_text_len + text_len + 1 > obj->Text.Size)
        return false;

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufSizeA)
        return false;

    ImWchar* text = obj->Text.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->Text[obj->CurLenW] = '\0';

    return true;
}